

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O0

back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
::
visit_node<std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
          (traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
           *this,index_pointer node,uint shifts,
          back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out)

{
  bool bVar1;
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> *this_00;
  value_type local_40;
  vector<pstore::address,_std::allocator<pstore::address>_> *local_38;
  uint local_2c;
  traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
  *ptStack_28;
  uint shifts_local;
  traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out_local;
  index_pointer node_local;
  
  local_2c = shifts;
  ptStack_28 = this;
  this_local = (traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)out.container;
  out_local.container = (vector<pstore::address,_std::allocator<pstore::address>_> *)node;
  bVar1 = pstore::index::details::index_pointer::is_leaf((index_pointer *)&out_local);
  if (bVar1) {
    bVar1 = pstore::index::details::index_pointer::is_address((index_pointer *)&out_local);
    if (!bVar1) {
      assert_failed("node.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                    ,0x62);
    }
    local_38 = out_local.container;
    bVar1 = traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::is_new((traverser<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,(index_pointer)out_local.container);
    if (bVar1) {
      local_40.a_ = (value_type)
                    pstore::index::details::index_pointer::to_address((index_pointer *)&out_local);
      this_00 = std::
                back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                ::operator*((back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                             *)&this_local);
      std::back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>::
      operator=(this_00,&local_40);
      std::back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>::
      operator++((back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                  *)&this_local);
    }
    node_local.internal_ = (internal_node *)this_local;
  }
  else {
    bVar1 = pstore::index::details::depth_is_internal_node(local_2c);
    if (bVar1) {
      node_local.addr_.a_ =
           (address)visit_intermediate<pstore::index::details::internal_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                              (this,(index_pointer)out_local.container,local_2c,
                               (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                                )this_local);
    }
    else {
      node_local.addr_.a_ =
           (address)visit_intermediate<pstore::index::details::linear_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                              (this,(index_pointer)out_local.container,local_2c,
                               (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>
                                )this_local);
    }
  }
  return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
         node_local.internal_;
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }